

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

HelicsInput
helicsFederateRegisterInput
          (HelicsFederate fed,char *key,HelicsDataTypes type,char *units,HelicsError *err)

{
  pointer pcVar1;
  size_type sVar2;
  string_view units_00;
  HelicsInput pvVar3;
  size_t sVar4;
  string *psVar5;
  Input *pIVar6;
  _Alloc_hider _Var7;
  string_view name;
  string_view type_00;
  __single_object inp;
  shared_ptr<helics::ValueFederate> fedObj;
  _Head_base<0UL,_helics::InputObject_*,_false> local_70;
  __uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_> local_68;
  __shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2> local_60;
  HelicsError *local_50;
  ValueFederate *local_48;
  size_t local_40;
  char *pcStack_38;
  
  getValueFedSharedPtr(&local_60,(HelicsError *)fed);
  if (local_60._M_ptr != (ValueFederate *)0x0) {
    if ((((uint)type < 10) || (type == HELICS_DATA_TYPE_ANY)) || (type == HELICS_DATA_TYPE_JSON)) {
      local_50 = err;
      std::make_unique<helics::InputObject>();
      local_48 = local_60._M_ptr;
      sVar4 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var7 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (key != (char *)0x0) {
        sVar4 = strlen(key);
        _Var7._M_p = key;
      }
      psVar5 = helics::typeNameStringRef_abi_cxx11_(type);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      sVar2 = psVar5->_M_string_length;
      local_40 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      pcStack_38 = (char *)gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (units != (char *)0x0) {
        local_40 = strlen(units);
        pcStack_38 = units;
      }
      units_00._M_str = pcStack_38;
      units_00._M_len = local_40;
      name._M_str = _Var7._M_p;
      name._M_len = sVar4;
      type_00._M_str = pcVar1;
      type_00._M_len = sVar2;
      pIVar6 = helics::ValueFederate::registerInput(local_48,name,type_00,units_00);
      (local_70._M_head_impl)->inputPtr = pIVar6;
      std::__shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&((local_70._M_head_impl)->fedptr).
                  super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>,&local_60);
      local_68._M_t.
      super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
      super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl =
           (tuple<helics::InputObject_*,_std::default_delete<helics::InputObject>_>)
           (tuple<helics::InputObject_*,_std::default_delete<helics::InputObject>_>)
           local_70._M_head_impl;
      local_70._M_head_impl = (InputObject *)0x0;
      pvVar3 = anon_unknown.dwarf_694c0::addInput
                         (fed,(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>
                               *)&local_68);
      std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
                ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
                 &local_68);
      std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
                ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
                 &local_70);
      goto LAB_00182907;
    }
    if (type == HELICS_DATA_TYPE_RAW) {
      pvVar3 = helicsFederateRegisterTypeInput(fed,key,"raw",units,err);
      goto LAB_00182907;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      err->message = "unrecognized type code";
    }
  }
  pvVar3 = (HelicsInput)0x0;
LAB_00182907:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  return pvVar3;
}

Assistant:

HelicsInput helicsFederateRegisterInput(HelicsFederate fed, const char* key, HelicsDataTypes type, const char* units, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    if ((type < HELICS_DATA_TYPE_STRING) || (type > HELICS_DATA_TYPE_CHAR)) {
        if (type == HELICS_DATA_TYPE_RAW) {
            return helicsFederateRegisterTypeInput(fed, key, "raw", units, err);
        }
        if (type != HELICS_DATA_TYPE_ANY && type != HELICS_DATA_TYPE_JSON) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, unknownTypeCode);
            return nullptr;
        }
    }

    try {
        auto inp = std::make_unique<helics::InputObject>();
        inp->inputPtr = &(fedObj->registerInput(AS_STRING_VIEW(key),
                                                helics::typeNameStringRef(static_cast<helics::DataType>(type)),
                                                AS_STRING_VIEW(units)));
        inp->fedptr = std::move(fedObj);
        return addInput(fed, std::move(inp));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}